

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O3

invocation_table<vending::events::load_done> *
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::state<vending::vending_def::on::maintenance::loading,afsm::inner_state_machine<vending::vending_def::on::maintenance,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::state<vending::vending_def::on::maintenance::idle,afsm::inner_state_machine<vending::vending_def::on::maintenance,afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>>
::state_table<vending::events::load_done,0ul,1ul>(indexes_tuple<0UL,_1UL> *param_1)

{
  if (state_table<vending::events::load_done,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)::
      _table == '\0') {
    state_table<vending::events::load_done,0ul,1ul>();
  }
  return &inner_dispatch_table<std::tuple<afsm::state<vending::vending_def::on::maintenance::loading,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<vending::vending_def::on::maintenance::idle,_afsm::inner_state_machine<vending::vending_def::on::maintenance,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_>
          ::state_table<vending::events::load_done,_0UL,_1UL>::_table;
}

Assistant:

static invocation_table<Event> const&
    state_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        static invocation_table<Event> _table {{ process_event_handler<Indexes>{}... }};
        return _table;
    }